

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiSapBroadphase.cpp
# Opt level: O0

void __thiscall
btMultiSapBroadphase::btMultiSapBroadphase
          (btMultiSapBroadphase *this,int param_2,btOverlappingPairCache *pairCache)

{
  btSortedOverlappingPairCache *this_00;
  btMultiSapOverlapFilterCallback *this_01;
  _func_int **in_RDX;
  btBroadphaseInterface *in_RDI;
  void *mem;
  void *mem_1;
  int in_stack_ffffffffffffff8c;
  btAlignedObjectArray<btMultiSapBroadphase::btMultiSapProxy_*> *in_stack_ffffffffffffff90;
  
  btBroadphaseInterface::btBroadphaseInterface(in_RDI);
  in_RDI->_vptr_btBroadphaseInterface = (_func_int **)&PTR__btMultiSapBroadphase_002e1fb8;
  btAlignedObjectArray<btBroadphaseInterface_*>::btAlignedObjectArray
            ((btAlignedObjectArray<btBroadphaseInterface_*> *)in_stack_ffffffffffffff90);
  in_RDI[6]._vptr_btBroadphaseInterface = in_RDX;
  in_RDI[7]._vptr_btBroadphaseInterface = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[8]._vptr_btBroadphaseInterface = 0;
  *(undefined4 *)&in_RDI[10]._vptr_btBroadphaseInterface = 0;
  btAlignedObjectArray<btMultiSapBroadphase::btMultiSapProxy_*>::btAlignedObjectArray
            (in_stack_ffffffffffffff90);
  if (in_RDI[6]._vptr_btBroadphaseInterface == (_func_int **)0x0) {
    *(undefined1 *)&in_RDI[8]._vptr_btBroadphaseInterface = 1;
    this_00 = (btSortedOverlappingPairCache *)
              btAlignedAllocInternal((size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    btSortedOverlappingPairCache::btSortedOverlappingPairCache(this_00);
    in_RDI[6]._vptr_btBroadphaseInterface = (_func_int **)this_00;
  }
  this_01 = (btMultiSapOverlapFilterCallback *)
            btAlignedAllocInternal((size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  (this_01->super_btOverlapFilterCallback)._vptr_btOverlapFilterCallback = (_func_int **)0x0;
  btMultiSapBroadphase::btMultiSapOverlapFilterCallback::btMultiSapOverlapFilterCallback(this_01);
  in_RDI[9]._vptr_btBroadphaseInterface = (_func_int **)this_01;
  (**(code **)(*in_RDI[6]._vptr_btBroadphaseInterface + 0x58))
            (in_RDI[6]._vptr_btBroadphaseInterface,in_RDI[9]._vptr_btBroadphaseInterface);
  return;
}

Assistant:

btMultiSapBroadphase::btMultiSapBroadphase(int /*maxProxies*/,btOverlappingPairCache* pairCache)
:m_overlappingPairs(pairCache),
m_optimizedAabbTree(0),
m_ownsPairCache(false),
m_invalidPair(0)
{
	if (!m_overlappingPairs)
	{
		m_ownsPairCache = true;
		void* mem = btAlignedAlloc(sizeof(btSortedOverlappingPairCache),16);
		m_overlappingPairs = new (mem)btSortedOverlappingPairCache();
	}

	struct btMultiSapOverlapFilterCallback : public btOverlapFilterCallback
	{
		virtual ~btMultiSapOverlapFilterCallback()
		{}
		// return true when pairs need collision
		virtual bool	needBroadphaseCollision(btBroadphaseProxy* childProxy0,btBroadphaseProxy* childProxy1) const
		{
			btBroadphaseProxy* multiProxy0 = (btBroadphaseProxy*)childProxy0->m_multiSapParentProxy;
			btBroadphaseProxy* multiProxy1 = (btBroadphaseProxy*)childProxy1->m_multiSapParentProxy;
			
			bool collides = (multiProxy0->m_collisionFilterGroup & multiProxy1->m_collisionFilterMask) != 0;
			collides = collides && (multiProxy1->m_collisionFilterGroup & multiProxy0->m_collisionFilterMask);
	
			return collides;
		}
	};

	void* mem = btAlignedAlloc(sizeof(btMultiSapOverlapFilterCallback),16);
	m_filterCallback = new (mem)btMultiSapOverlapFilterCallback();

	m_overlappingPairs->setOverlapFilterCallback(m_filterCallback);
//	mem = btAlignedAlloc(sizeof(btSimpleBroadphase),16);
//	m_simpleBroadphase = new (mem) btSimpleBroadphase(maxProxies,m_overlappingPairs);
}